

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int AnalyzeMTMessage(uchar *buf,int buflen,int addr,int mid)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if ((((4 < buflen) && (*buf == 0xfa)) && (buf[1] == (uchar)addr)) &&
     ((buf[2] == (uchar)mid && ((6 < (uint)buflen || (buf[3] != 0xff)))))) {
    iVar1 = GetLengthMTMessage(buf);
    if (iVar1 <= buflen) {
      iVar1 = CheckMTChecksum(buf,iVar1);
      uVar2 = (uint)(iVar1 != 0);
    }
  }
  return uVar2;
}

Assistant:

inline int AnalyzeMTMessage(unsigned char* buf, int buflen, int addr, int mid)
{
	int msglen = 0;

	// Check number of bytes.
	if (buflen < MIN_STANDARD_BUF_LEN_MT)
	{
		//printf("Invalid number of bytes.\n");
		return EXIT_FAILURE;
	}
	// Check preamble.
	if (buf[0] != PREAMBLE_MT)
	{
		//printf("Invalid preamble.\n");
		return EXIT_FAILURE;
	}
	// Check device address.
	if (buf[1] != (unsigned char)addr)
	{
		//printf("Invalid device address.\n");
		return EXIT_FAILURE;
	}
	// Check message identifier.
	if (buf[2] != (unsigned char)mid)
	{
		//printf("Invalid message identifier.\n");
		return EXIT_FAILURE;
	}
	// Check number of data bytes.
	if (buf[3] == EXT_LEN_MT)
	{
		if (buflen < MIN_EXTENDED_BUF_LEN_MT)
		{
			//printf("Invalid number of bytes.\n");
			return EXIT_FAILURE;
		}
	}
	msglen = GetLengthMTMessage(buf);	
	if (buflen < msglen)
	{
		//printf("Incomplete message.\n");
		return EXIT_FAILURE;
	}
	// Checksum.
	if (CheckMTChecksum(buf, msglen) != EXIT_SUCCESS)
	{ 
		//printf("Invalid checksum.\n");
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}